

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cc
# Opt level: O2

void __thiscall OverlaySpace::restoreXml(OverlaySpace *this,Element *el)

{
  string *__rhs;
  uint4 *puVar1;
  byte *pbVar2;
  uint4 uVar3;
  int4 iVar4;
  uint uVar5;
  string *psVar6;
  AddrSpace *pAVar7;
  LowlevelError *this_00;
  allocator local_1e1;
  string basename;
  string local_1c0;
  istringstream s1;
  uint auStack_188 [90];
  
  std::__cxx11::string::string((string *)&s1,"name",(allocator *)&basename);
  Element::getAttributeValue(el,(string *)&s1);
  __rhs = &(this->super_AddrSpace).name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  std::__cxx11::string::~string((string *)&s1);
  std::__cxx11::string::string((string *)&basename,"index",(allocator *)&local_1c0);
  psVar6 = Element::getAttributeValue(el,&basename);
  std::__cxx11::istringstream::istringstream((istringstream *)&s1,(string *)psVar6,_S_in);
  std::__cxx11::string::~string((string *)&basename);
  *(uint *)((long)auStack_188 + *(long *)(_s1 + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(_s1 + -0x18)) & 0xffffffb5;
  std::istream::operator>>(&s1,&(this->super_AddrSpace).index);
  std::__cxx11::string::string((string *)&local_1c0,"base",&local_1e1);
  psVar6 = Element::getAttributeValue(el,&local_1c0);
  std::__cxx11::string::string((string *)&basename,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_1c0);
  pAVar7 = AddrSpaceManager::getSpaceByName((this->super_AddrSpace).manage,&basename);
  this->baseSpace = pAVar7;
  if (pAVar7 != (AddrSpace *)0x0) {
    uVar3 = pAVar7->wordsize;
    (this->super_AddrSpace).addressSize = pAVar7->addressSize;
    (this->super_AddrSpace).wordsize = uVar3;
    iVar4 = pAVar7->deadcodedelay;
    (this->super_AddrSpace).delay = pAVar7->delay;
    (this->super_AddrSpace).deadcodedelay = iVar4;
    AddrSpace::calcScaleMask(&this->super_AddrSpace);
    pAVar7 = this->baseSpace;
    uVar5 = pAVar7->flags;
    if ((uVar5 & 1) != 0) {
      puVar1 = &(this->super_AddrSpace).flags;
      *(byte *)puVar1 = (byte)*puVar1 | 1;
      uVar5 = pAVar7->flags;
    }
    if ((uVar5 >> 8 & 1) != 0) {
      pbVar2 = (byte *)((long)&(this->super_AddrSpace).flags + 1);
      *pbVar2 = *pbVar2 | 1;
    }
    std::__cxx11::string::~string((string *)&basename);
    std::__cxx11::istringstream::~istringstream((istringstream *)&s1);
    return;
  }
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::operator+(&local_1c0,"Base space does not exist for overlay space: ",__rhs);
  LowlevelError::LowlevelError(this_00,&local_1c0);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

void OverlaySpace::restoreXml(const Element *el)

{
  name = el->getAttributeValue("name");
  istringstream s1(el->getAttributeValue("index"));
  s1.unsetf(ios::dec | ios::hex | ios::oct);
  s1 >> index;
  
  string basename = el->getAttributeValue("base");
  baseSpace = getManager()->getSpaceByName(basename);
  if (baseSpace == (AddrSpace *)0)
    throw LowlevelError("Base space does not exist for overlay space: "+name);
  addressSize = baseSpace->getAddrSize();
  wordsize = baseSpace->getWordSize();
  delay = baseSpace->getDelay();
  deadcodedelay = baseSpace->getDeadcodeDelay();
  calcScaleMask();

  if (baseSpace->isBigEndian())
    setFlags(big_endian);
  if (baseSpace->hasPhysical())
    setFlags(hasphysical);
}